

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_bpe_session::check_double_bos_eos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  llama_token lVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference piVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  uint in_stack_ffffffffffffffd0;
  value_type in_stack_ffffffffffffffd4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = llama_vocab::get_add_bos((llama_vocab *)0x540de0);
  if ((bVar1) && (sVar4 = std::vector<int,_std::allocator<int>_>::size(local_10), 1 < sVar4)) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,1);
    in_stack_ffffffffffffffd4 = *pvVar3;
    lVar2 = llama_vocab::token_bos((llama_vocab *)0x540e1b);
    if (in_stack_ffffffffffffffd4 == lVar2) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "%s: Added a BOS token to the prompt as specified by the model but the prompt also starts with a BOS token. So now the final prompt starts with 2 BOS tokens. Are you sure this is what you want?\n"
                         ,"check_double_bos_eos");
    }
  }
  bVar1 = llama_vocab::get_add_eos((llama_vocab *)0x540e4c);
  in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 & 0xffffff;
  if (bVar1) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(local_10);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (1 < sVar4) {
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_18 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator-(in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_18);
      iVar6 = *piVar5;
      lVar2 = llama_vocab::token_eos((llama_vocab *)0x540eb7);
      in_stack_ffffffffffffffd0 = (uint)(iVar6 == lVar2) << 0x18;
    }
  }
  if ((char)(in_stack_ffffffffffffffd0 >> 0x18) != '\0') {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: Added a EOS token to the prompt as specified by the model but the prompt also ends with a EOS token. So now the final prompt ends with 2 EOS tokens. Are you sure this is what you want?\n"
                       ,"check_double_bos_eos");
  }
  return;
}

Assistant:

void check_double_bos_eos(const std::vector<llama_token> & output) const {
        if (vocab.get_add_bos() && output.size() >= 2 && output[1] == vocab.token_bos()) {
            LLAMA_LOG_WARN(
                "%s: Added a BOS token to the prompt as specified by the model but the prompt "
                "also starts with a BOS token. So now the final prompt starts with 2 BOS tokens. "
                "Are you sure this is what you want?\n", __FUNCTION__);
        }
        if (vocab.get_add_eos() && output.size() >= 2 && *(output.end()-2) == vocab.token_eos()) {
            LLAMA_LOG_WARN(
                "%s: Added a EOS token to the prompt as specified by the model but the prompt "
                "also ends with a EOS token. So now the final prompt ends with 2 EOS tokens. "
                "Are you sure this is what you want?\n", __FUNCTION__);
        }
    }